

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_vendor.cpp
# Opt level: O1

void __thiscall SimpleVendor::Vend(SimpleVendor *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  bVar5 = ProcessUserInput(this);
  if (bVar5) {
    (*this->vio->_vptr_VendorIo[3])(this->vio,(ulong)(uint)(this->super_Vendor).balance_);
    iVar1 = (this->super_Vendor).kPrice;
    iVar2 = (this->super_Vendor).balance_;
    if (iVar2 < iVar1) {
      (*this->vio->_vptr_VendorIo[5])(this->vio,(ulong)(uint)(iVar1 - iVar2));
    }
    else {
      (this->super_Vendor).balance_ = iVar2 - iVar1;
      (*this->vio->_vptr_VendorIo[4])();
      uVar3 = (this->super_Vendor).balance_;
      uVar4 = uVar3 - 5;
      if ((uVar3 & 1) == 0) {
        uVar4 = uVar3;
      }
      (*this->vio->_vptr_VendorIo[2])(this->vio,(ulong)uVar3,(ulong)(uint)((int)uVar4 / 10));
      (this->super_Vendor).balance_ = 0;
    }
    (*(this->super_Vendor)._vptr_Vendor[1])(this);
    return;
  }
  return;
}

Assistant:

void SimpleVendor::Vend() {
    if (!ProcessUserInput()) return; // if user wants to quit, break out of our recursion
    vio->PrintBalance(GetBalance());
    if (GetBalance() >= GetPrice()) {
        SetBalance(GetBalance() - GetPrice());
        vio->PrintThankYouMessage();
        DispenseChange();
    } else vio->PrintMoreCoinsNeeded(GetPrice() - GetBalance());
    return Vend(); // recursive call
}